

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-threadpool-cancel.c
# Opt level: O2

void getnameinfo_cb(uv_getnameinfo_t *handle,int status,char *hostname,char *service)

{
  char *pcVar1;
  undefined8 uVar2;
  char *__format;
  char *pcVar3;
  int64_t eval_b;
  int64_t eval_a;
  char *pcVar4;
  undefined8 uVar5;
  
  pcVar1 = (char *)(long)status;
  if (pcVar1 == (char *)0xfffffffffffff445) {
    if (hostname == (char *)0x0) {
      if (service == (char *)0x0) {
        return;
      }
      uVar5 = 0;
      pcVar4 = "NULL";
      __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
      pcVar3 = "service";
      uVar2 = 0x94;
      pcVar1 = service;
    }
    else {
      uVar5 = 0;
      pcVar4 = "NULL";
      __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
      pcVar3 = "hostname";
      uVar2 = 0x93;
      pcVar1 = hostname;
    }
  }
  else {
    uVar5 = 0xfffffffffffff445;
    pcVar4 = "UV_EAI_CANCELED";
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
    pcVar3 = "status";
    uVar2 = 0x92;
  }
  fprintf(_stderr,__format,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-threadpool-cancel.c"
          ,uVar2,pcVar3,"==",pcVar4,pcVar1,"==",uVar5);
  abort();
}

Assistant:

static void getnameinfo_cb(uv_getnameinfo_t* handle,
                           int status,
                           const char* hostname,
                           const char* service) {
  ASSERT_EQ(status, UV_EAI_CANCELED);
  ASSERT_NULL(hostname);
  ASSERT_NULL(service);
}